

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

FunctionInfo * __thiscall
Js::DynamicProfileInfo::GetCallApplyTargetInfo
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId)

{
  ushort uVar1;
  CallSiteInfo *pCVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  SourceContextInfo *pSVar7;
  ScriptContext *pSVar8;
  void *pvVar9;
  FunctionInfo *pFVar10;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x48f,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar4) goto LAB_00961db7;
    *puVar6 = 0;
  }
  if (functionBody->profiledCallSiteCount <= callSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x491,"(callSiteId < callSiteCount)","callSiteId < callSiteCount");
    if (!bVar4) goto LAB_00961db7;
    *puVar6 = 0;
  }
  if (((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.field_0x44 & 0xc) == 0) {
    pSVar7 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)functionBody);
    pSVar8 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    if ((((pSVar8->super_ScriptContextBase).javascriptLibrary)->cache).noContextSourceContextInfo.
        ptr == pSVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x492,
                                  "(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody))"
                                  ,
                                  "functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody)"
                                 );
      if (!bVar4) goto LAB_00961db7;
      *puVar6 = 0;
    }
  }
  pvVar9 = FunctionProxy::GetAuxPtr((FunctionProxy *)functionBody,CallSiteToCallApplyCallSiteArray);
  if (pvVar9 != (void *)0x0) {
    pvVar9 = FunctionProxy::GetAuxPtr
                       ((FunctionProxy *)functionBody,CallSiteToCallApplyCallSiteArray);
    uVar1 = *(ushort *)((long)pvVar9 + (ulong)callSiteId * 2);
    if (uVar1 != 0xffff) {
      uVar5 = FunctionBody::GetCountField(functionBody,ProfiledCallApplyCallSiteCount);
      if ((ushort)uVar5 <= uVar1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                    ,0x49c,
                                    "(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount())"
                                    ,
                                    "callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount()"
                                   );
        if (!bVar4) {
LAB_00961db7:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      pCVar2 = (this->callApplyTargetInfo).ptr;
      if (-1 < *(short *)&pCVar2[uVar1].field_0x2) {
        pFVar10 = GetFunctionInfo(functionBody,pCVar2[uVar1].u.functionData.sourceId,
                                  pCVar2[uVar1].u.functionData.functionId);
        return pFVar10;
      }
    }
  }
  return (FunctionInfo *)0x0;
}

Assistant:

FunctionInfo * DynamicProfileInfo::GetCallApplyTargetInfo(FunctionBody * functionBody, ProfileId callSiteId)
    {
        Assert(functionBody != nullptr);
        Js::ProfileId callSiteCount = functionBody->GetProfiledCallSiteCount();
        Assert(callSiteId < callSiteCount);
        Assert(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody));

        if (functionBody->GetCallSiteToCallApplyCallSiteArray())
        {
            Js::ProfileId callApplyCallSiteId = functionBody->GetCallSiteToCallApplyCallSiteArray()[callSiteId];
            if (callApplyCallSiteId == Js::Constants::NoProfileId)
            {
                return nullptr;
            } 
            
            Assert(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount());
            
            if (callApplyTargetInfo[callApplyCallSiteId].isPolymorphic)
            {
                return nullptr;
            }

            return GetFunctionInfo(functionBody, callApplyTargetInfo[callApplyCallSiteId].u.functionData.sourceId, callApplyTargetInfo[callApplyCallSiteId].u.functionData.functionId);
        }

        return nullptr;
    }